

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_synthesis.cpp
# Opt level: O2

void __thiscall ColValCondDAGNode::~ColValCondDAGNode(ColValCondDAGNode *this)

{
  std::__cxx11::string::~string((string *)&this->left_col_name_);
  return;
}

Assistant:

~ColValCondDAGNode() final {
    }